

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t FSE_writeNCount(void *buffer,size_t bufferSize,short *normalizedCounter,uint maxSymbolValue,
                      uint tableLog)

{
  size_t sVar1;
  uint in_ECX;
  ulong in_RSI;
  uint in_R8D;
  size_t in_stack_00000030;
  void *in_stack_00000038;
  undefined8 local_8;
  
  if (in_R8D < 0xd) {
    if (in_R8D < 5) {
      local_8 = 0xffffffffffffffff;
    }
    else {
      sVar1 = FSE_NCountWriteBound(in_ECX,in_R8D);
      if (in_RSI < sVar1) {
        local_8 = FSE_writeNCount_generic
                            (in_stack_00000038,in_stack_00000030,(short *)buffer,bufferSize._4_4_,
                             (uint)bufferSize,normalizedCounter._4_4_);
      }
      else {
        local_8 = FSE_writeNCount_generic
                            (in_stack_00000038,in_stack_00000030,(short *)buffer,bufferSize._4_4_,
                             (uint)bufferSize,normalizedCounter._4_4_);
      }
    }
  }
  else {
    local_8 = 0xffffffffffffffd4;
  }
  return local_8;
}

Assistant:

size_t FSE_writeNCount (void* buffer, size_t bufferSize,
                  const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog)
{
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);   /* Unsupported */
    if (tableLog < FSE_MIN_TABLELOG) return ERROR(GENERIC);   /* Unsupported */

    if (bufferSize < FSE_NCountWriteBound(maxSymbolValue, tableLog))
        return FSE_writeNCount_generic(buffer, bufferSize, normalizedCounter, maxSymbolValue, tableLog, 0);

    return FSE_writeNCount_generic(buffer, bufferSize, normalizedCounter, maxSymbolValue, tableLog, 1 /* write in buffer is safe */);
}